

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

void rehash(st_table *table)

{
  uint uVar1;
  st_table_entry **ppsVar2;
  st_table_entry *psVar3;
  ulong uVar4;
  st_table_entry *psVar5;
  long lVar6;
  st_table_entry **ppsVar7;
  int newsize;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = table->num_bins;
  iVar8 = 8;
  lVar6 = 0;
  do {
    if ((int)(uVar1 + 1) < iVar8) {
      uVar9 = *(uint *)((long)primes + lVar6);
      goto LAB_0012ce95;
    }
    iVar8 = iVar8 * 2;
    lVar6 = lVar6 + 8;
  } while ((int)lVar6 != 0xe8);
  uVar9 = 0xffffffff;
LAB_0012ce95:
  if ((0 < (int)uVar9) &&
     (ppsVar7 = (st_table_entry **)calloc((ulong)uVar9,8), ppsVar7 != (st_table_entry **)0x0)) {
    if (0 < (int)uVar1) {
      ppsVar2 = table->bins;
      uVar10 = 0;
      do {
        psVar5 = ppsVar2[uVar10];
        while (psVar5 != (st_table_entry *)0x0) {
          psVar3 = psVar5->next;
          uVar4 = (ulong)psVar5->hash % (ulong)uVar9;
          psVar5->next = ppsVar7[uVar4];
          ppsVar7[uVar4] = psVar5;
          psVar5 = psVar3;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar1);
    }
    free(table->bins);
    table->num_bins = uVar9;
    table->bins = ppsVar7;
  }
  return;
}

Assistant:

static void
rehash(register st_table* table)
{
  register st_table_entry *ptr, *next, **new_bins;
  int i, new_num_bins, old_num_bins;
  unsigned int hash_val;

  old_num_bins = table->num_bins;
  new_num_bins = new_size(old_num_bins + 1);
  if (new_num_bins <= 0) return ;

  new_bins = (st_table_entry**)Calloc(new_num_bins, sizeof(st_table_entry*));
  if (new_bins == 0) {
    return ;
  }

  for(i = 0; i < old_num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    hash_val = ptr->hash % new_num_bins;
	    ptr->next = new_bins[hash_val];
	    new_bins[hash_val] = ptr;
	    ptr = next;
    }
  }
  free(table->bins);
  table->num_bins = new_num_bins;
  table->bins = new_bins;
}